

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::HEARTGenerator::getOrAddProcessorInstance
          (HEARTGenerator *this,pool_ptr<soul::AST::ProcessorInstance> *instance)

{
  Module *this_00;
  bool bVar1;
  __type_conflict1 _Var2;
  uint uVar3;
  ProcessorInstance *pPVar4;
  UnqualifiedName *pUVar5;
  pool_ptr<soul::AST::Connection::SharedEndpoint> *this_01;
  reference ppVar6;
  Graph *pGVar7;
  ProcessorInstance *pPVar8;
  ClockMultiplier *pCVar9;
  Expression *pEVar10;
  Constant *pCVar11;
  pool_ptr<soul::AST::ProcessorInstance> *in_RDX;
  pool_ref<soul::heart::ProcessorInstance> local_1f0;
  CompileMessage local_1e8;
  pool_ptr<soul::AST::Constant> local_1b0;
  pool_ptr<soul::AST::Constant> c_1;
  pool_ptr<soul::AST::Constant> local_170;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::AST::Expression> local_160;
  _Optional_payload_base<unsigned_int> local_158;
  IdentifierPath local_150;
  string local_f8;
  CodeLocation local_d8;
  ProcessorInstance *local_c8;
  ProcessorInstance *p;
  ProcessorBase *targetProcessor;
  pool_ref *local_98;
  pool_ref<soul::AST::ProcessorInstance> *i_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range2_1;
  pool_ref<soul::heart::ProcessorInstance> local_60;
  pool_ref<soul::heart::ProcessorInstance> i;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  *__range2;
  string instanceName;
  pool_ptr<soul::AST::ProcessorInstance> *instance_local;
  HEARTGenerator *this_local;
  
  bVar1 = pool_ptr<soul::AST::ProcessorInstance>::operator==(in_RDX,(void *)0x0);
  if (bVar1) {
    pool_ptr<soul::heart::ProcessorInstance>::pool_ptr
              ((pool_ptr<soul::heart::ProcessorInstance> *)this);
  }
  else {
    pPVar4 = pool_ptr<soul::AST::ProcessorInstance>::operator->(in_RDX);
    pUVar5 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pPVar4->instanceName);
    AST::UnqualifiedName::toString_abi_cxx11_((string *)&__range2,pUVar5);
    this_01 = &instance[3].object[1].implicitInstanceSource;
    __end2 = std::
             vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
             ::begin((vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
                      *)this_01);
    i.object = (ProcessorInstance *)
               std::
               vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
               ::end((vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
                      *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
                                       *)&i), bVar1) {
      ppVar6 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
               ::operator*(&__end2);
      local_60.object = ppVar6->object;
      pPVar8 = pool_ref<soul::heart::ProcessorInstance>::operator->(&local_60);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range2,&pPVar8->instanceName);
      if (_Var2) {
        pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
      }
      pool_ref<soul::heart::ProcessorInstance>::~pool_ref(&local_60);
      if (_Var2) goto LAB_00427204;
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>_>
      ::operator++(&__end2);
    }
    pGVar7 = pool_ptr<const_soul::AST::Graph>::operator->
                       ((pool_ptr<const_soul::AST::Graph> *)(instance + 1));
    __end2_1 = std::
               vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
               ::begin(&pGVar7->processorInstances);
    i_1 = (pool_ref<soul::AST::ProcessorInstance> *)
          std::
          vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
          ::end(&pGVar7->processorInstances);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                               *)&i_1), bVar1) {
      local_98 = (pool_ref *)
                 __gnu_cxx::
                 __normal_iterator<const_soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                 ::operator*(&__end2_1);
      pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
      pUVar5 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pPVar4->instanceName);
      AST::UnqualifiedName::toString_abi_cxx11_((string *)&targetProcessor,pUVar5);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &targetProcessor,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range2);
      std::__cxx11::string::~string((string *)&targetProcessor);
      if (_Var2) {
        pGVar7 = pool_ptr<const_soul::AST::Graph>::operator->
                           ((pool_ptr<const_soul::AST::Graph> *)(instance + 1));
        pPVar4 = pool_ref::operator_cast_to_ProcessorInstance_(local_98);
        p = (ProcessorInstance *)
            AST::Scope::findSingleMatchingProcessor
                      (&(pGVar7->super_ProcessorBase).super_ModuleBase.super_Scope,pPVar4);
        this_00 = (Module *)instance[3].object;
        local_d8.sourceCode.object = (SourceCodeText *)0x0;
        local_d8.location.data = (char *)0x0;
        CodeLocation::CodeLocation(&local_d8);
        pPVar8 = Module::allocate<soul::heart::ProcessorInstance,soul::CodeLocation>
                           (this_00,&local_d8);
        CodeLocation::~CodeLocation(&local_d8);
        local_c8 = pPVar8;
        std::__cxx11::string::operator=((string *)&pPVar8->instanceName,(string *)&__range2);
        (*(p->super_Object)._vptr_Object[0xd])(&local_150);
        IdentifierPath::toString_abi_cxx11_(&local_f8,&local_150);
        std::__cxx11::string::operator=((string *)&local_c8->sourceName,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        IdentifierPath::~IdentifierPath(&local_150);
        pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                           ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
        local_160.object = (pPVar4->arraySize).object;
        local_158 = (_Optional_payload_base<unsigned_int>)getProcessorArraySize(&local_160);
        c.object._4_4_ = 1;
        uVar3 = std::optional<unsigned_int>::value_or<int>
                          ((optional<unsigned_int> *)&local_158,(int *)((long)&c.object + 4));
        local_c8->arraySize = uVar3;
        pool_ptr<soul::AST::Expression>::~pool_ptr(&local_160);
        pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                           ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
        bVar1 = pool_ptr<soul::AST::Expression>::operator!=
                          (&pPVar4->clockMultiplierRatio,(void *)0x0);
        if (bVar1) {
          pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                             ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
          pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&pPVar4->clockMultiplierRatio);
          (*(pEVar10->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_170);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_170);
          if (!bVar1) {
            pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                               ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
            pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&pPVar4->clockMultiplierRatio);
            Errors::ratioMustBeInteger<>();
            AST::Context::throwError
                      (&(pEVar10->super_Statement).super_ASTObject.context,(CompileMessage *)&c_1,
                       false);
          }
          pCVar9 = &local_c8->clockMultiplier;
          pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                             ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
          pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&pPVar4->clockMultiplierRatio);
          pCVar11 = pool_ptr<soul::AST::Constant>::operator->(&local_170);
          heart::ClockMultiplier::setMultiplier<soul::AST::Context&>
                    (pCVar9,&(pEVar10->super_Statement).super_ASTObject.context,&pCVar11->value);
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_170);
        }
        pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                           ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
        bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&pPVar4->clockDividerRatio,(void *)0x0);
        if (bVar1) {
          pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                             ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
          pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&pPVar4->clockDividerRatio);
          (*(pEVar10->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1b0);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1b0);
          if (!bVar1) {
            pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                               ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
            pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&pPVar4->clockDividerRatio);
            Errors::ratioMustBeInteger<>();
            AST::Context::throwError
                      (&(pEVar10->super_Statement).super_ASTObject.context,&local_1e8,false);
          }
          pCVar9 = &local_c8->clockMultiplier;
          pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                             ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
          pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&pPVar4->clockDividerRatio);
          pCVar11 = pool_ptr<soul::AST::Constant>::operator->(&local_1b0);
          heart::ClockMultiplier::setDivider<soul::AST::Context&>
                    (pCVar9,&(pEVar10->super_Statement).super_ASTObject.context,&pCVar11->value);
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_1b0);
        }
        pPVar4 = pool_ref<soul::AST::ProcessorInstance>::operator->
                           ((pool_ref<soul::AST::ProcessorInstance> *)local_98);
        bVar1 = pool_ptr<soul::AST::Expression>::operator==(&pPVar4->specialisationArgs,(void *)0x0)
        ;
        checkAssertion(bVar1,"i->specialisationArgs == nullptr","getOrAddProcessorInstance",0x14f);
        pPVar4 = instance[3].object;
        pool_ref<soul::heart::ProcessorInstance>::pool_ref<soul::heart::ProcessorInstance,void>
                  (&local_1f0,local_c8);
        std::
        vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
        ::push_back((vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
                     *)&pPVar4[1].implicitInstanceSource,&local_1f0);
        pool_ref<soul::heart::ProcessorInstance>::~pool_ref(&local_1f0);
        pool_ptr<soul::heart::ProcessorInstance>::pool_ptr<soul::heart::ProcessorInstance,void>
                  ((pool_ptr<soul::heart::ProcessorInstance> *)this,local_c8);
        goto LAB_00427204;
      }
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
      ::operator++(&__end2_1);
    }
    pool_ptr<soul::heart::ProcessorInstance>::pool_ptr
              ((pool_ptr<soul::heart::ProcessorInstance> *)this);
LAB_00427204:
    std::__cxx11::string::~string((string *)&__range2);
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<heart::ProcessorInstance> getOrAddProcessorInstance (pool_ptr<AST::ProcessorInstance> instance)
    {
        if (instance == nullptr)
            return {};

        auto instanceName = instance->instanceName->toString();

        for (auto i : module.processorInstances)
            if (instanceName == i->instanceName)
                return i;

        for (auto& i : sourceGraph->processorInstances)
        {
            if (i->instanceName->toString() == instanceName)
            {
                auto& targetProcessor = sourceGraph->findSingleMatchingProcessor (i);

                auto& p = module.allocate<heart::ProcessorInstance> (CodeLocation{});
                p.instanceName = instanceName;
                p.sourceName = targetProcessor.getFullyQualifiedPath().toString();
                p.arraySize = getProcessorArraySize (i->arraySize).value_or (1);

                if (i->clockMultiplierRatio != nullptr)
                {
                    if (auto c = i->clockMultiplierRatio->getAsConstant())
                        p.clockMultiplier.setMultiplier (i->clockMultiplierRatio->context, c->value);
                    else
                        i->clockMultiplierRatio->context.throwError (Errors::ratioMustBeInteger());
                }

                if (i->clockDividerRatio != nullptr)
                {
                    if (auto c = i->clockDividerRatio->getAsConstant())
                        p.clockMultiplier.setDivider (i->clockDividerRatio->context, c->value);
                    else
                        i->clockDividerRatio->context.throwError (Errors::ratioMustBeInteger());
                }

                SOUL_ASSERT (i->specialisationArgs == nullptr);

                module.processorInstances.push_back (p);
                return p;
            }
        }

        return {};
    }